

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_kiss.cpp
# Opt level: O1

void __thiscall
ear::WorkBufKiss<double>::WorkBufKiss
          (WorkBufKiss<double> *this,size_t n_fft,kissfft<double> *plan_forward,
          kissfft<double> *plan_reverse)

{
  allocator_type local_2a;
  allocator_type local_29;
  
  (this->super_FFTWorkBuf)._vptr_FFTWorkBuf = (_func_int **)&PTR__WorkBufKiss_00197c80;
  kissfft<double>::kissfft(&this->plan_forward,plan_forward);
  kissfft<double>::kissfft(&this->plan_reverse,plan_reverse);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->reverse_tmp_input,n_fft,&local_29);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->reverse_tmp_output,n_fft,&local_2a);
  return;
}

Assistant:

WorkBufKiss(size_t n_fft, kissfft<Real> plan_forward,
                kissfft<Real> plan_reverse)
        : plan_forward(plan_forward),
          plan_reverse(plan_reverse),
          reverse_tmp_input(n_fft),
          reverse_tmp_output(n_fft) {}